

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::
     UpdateStats(BitpackingCompressionState<unsigned_char,_true,_signed_char> *state,idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  undefined1 uVar2;
  pointer pCVar3;
  byte bVar4;
  byte bVar5;
  
  this = &state->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    bVar4 = (state->state).maximum;
    bVar5 = (pCVar3->stats).statistics.stats_union.string_data.max[0];
    if (bVar4 <= bVar5) {
      bVar5 = bVar4;
    }
    (pCVar3->stats).statistics.stats_union.string_data.max[0] = bVar5;
    bVar5 = *(byte *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (bVar4 < bVar5) {
      bVar4 = bVar5;
    }
    *(byte *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = bVar4;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    uVar2 = (state->state).minimum;
    bVar4 = (pCVar3->stats).statistics.stats_union.string_data.max[0];
    if ((byte)uVar2 <= bVar4) {
      bVar4 = uVar2;
    }
    (pCVar3->stats).statistics.stats_union.string_data.max[0] = bVar4;
    bVar4 = *(byte *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    bVar5 = uVar2;
    if ((byte)uVar2 < bVar4) {
      bVar5 = bVar4;
    }
    *(byte *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = bVar5;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}